

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

buffer_appender<char>
fmt::v7::detail::format_uint<4u,char,fmt::v7::detail::buffer_appender<char>,unsigned__int128>
          (buffer_appender<char> out,unsigned___int128 value,int num_digits,bool upper)

{
  detail *this;
  uint in_ECX;
  int num_digits_00;
  undefined7 in_register_00000011;
  undefined4 in_register_00000034;
  undefined1 in_stack_ffffffffffffffa8 [16];
  
  this = (detail *)to_pointer<char>(out,(ulong)in_ECX);
  num_digits_00 = (int)CONCAT71(in_register_00000011,upper);
  if (this == (detail *)0x0) {
    format_uint<4u,char,unsigned__int128>
              ((detail *)&stack0xffffffffffffffa8,(char *)CONCAT44(in_register_00000034,num_digits),
               (unsigned___int128)in_stack_ffffffffffffffa8,num_digits_00,SUB41(in_ECX,0));
    out = std::__copy_move<false,false,std::random_access_iterator_tag>::
          __copy_m<char*,fmt::v7::detail::buffer_appender<char>>
                    (&stack0xffffffffffffffa8,&stack0xffffffffffffffa8 + (int)in_ECX,out);
  }
  else {
    format_uint<4u,char,unsigned__int128>
              (this,(char *)CONCAT44(in_register_00000034,num_digits),
               (unsigned___int128)in_stack_ffffffffffffffa8,num_digits_00,SUB41(in_ECX,0));
  }
  return (back_insert_iterator<fmt::v7::detail::buffer<char>_>)
         out.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container;
}

Assistant:

inline It format_uint(It out, UInt value, int num_digits, bool upper = false) {
  if (auto ptr = to_pointer<Char>(out, to_unsigned(num_digits))) {
    format_uint<BASE_BITS>(ptr, value, num_digits, upper);
    return out;
  }
  // Buffer should be large enough to hold all digits (digits / BASE_BITS + 1).
  char buffer[num_bits<UInt>() / BASE_BITS + 1];
  format_uint<BASE_BITS>(buffer, value, num_digits, upper);
  return detail::copy_str<Char>(buffer, buffer + num_digits, out);
}